

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void init_colors(void)

{
  init_pair(1,4,0);
  init_pair(2,2,0);
  init_pair(3,6,0);
  init_pair(4,5,0);
  init_pair(5,3,0);
  init_pair(6,1,0);
  return;
}

Assistant:

void init_colors() {
  init_pair(1,COLOR_BLUE,COLOR_BLACK);
  init_pair(2,COLOR_GREEN,COLOR_BLACK);
  init_pair(3,COLOR_CYAN,COLOR_BLACK);
  init_pair(4,COLOR_MAGENTA,COLOR_BLACK);
  init_pair(5,COLOR_YELLOW,COLOR_BLACK);
  init_pair(6,COLOR_RED,COLOR_BLACK);
}